

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clump.cpp
# Opt level: O0

void __thiscall rw::Atomic::setGeometry(Atomic *this,Geometry *geo,uint32 flags)

{
  MorphTarget *pMVar1;
  float32 fVar2;
  Frame *pFVar3;
  uint32 flags_local;
  Geometry *geo_local;
  Atomic *this_local;
  
  if (this->geometry != (Geometry *)0x0) {
    Geometry::destroy(this->geometry);
  }
  if (geo != (Geometry *)0x0) {
    Geometry::addRef(geo);
  }
  this->geometry = geo;
  if (((flags & 1) == 0) && (geo != (Geometry *)0x0)) {
    pMVar1 = geo->morphTargets;
    fVar2 = (pMVar1->boundingSphere).center.y;
    (this->boundingSphere).center.x = (pMVar1->boundingSphere).center.x;
    (this->boundingSphere).center.y = fVar2;
    *(undefined8 *)&(this->boundingSphere).center.z =
         *(undefined8 *)&(pMVar1->boundingSphere).center.z;
    pFVar3 = getFrame(this);
    if (pFVar3 != (Frame *)0x0) {
      pFVar3 = getFrame(this);
      Frame::updateObjects(pFVar3);
    }
  }
  return;
}

Assistant:

void
Atomic::setGeometry(Geometry *geo, uint32 flags)
{
	if(this->geometry)
		this->geometry->destroy();
	if(geo)
		geo->addRef();
	this->geometry = geo;
	if(flags & SAMEBOUNDINGSPHERE)
		return;
	if(geo){
		this->boundingSphere = geo->morphTargets[0].boundingSphere;
		if(this->getFrame())	// TODO: && getWorld???
			this->getFrame()->updateObjects();
	}
}